

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O2

DataFlowState * __thiscall
slang::analysis::DataFlowAnalysis::topState
          (DataFlowState *__return_storage_ptr__,DataFlowAnalysis *this)

{
  char *__s;
  
  __s = (__return_storage_ptr__->assigned).
        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.firstElement;
  memset(__s,0,0x88);
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ = (pointer)__s
  ;
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len = 0;
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.cap = 2;
  __return_storage_ptr__->reachable = true;
  return __return_storage_ptr__;
}

Assistant:

DataFlowState DataFlowAnalysis::topState() const {
    return {};
}